

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O0

int checkBooleanOption(char *option)

{
  int iVar1;
  size_t sVar2;
  char *in_RDI;
  int o;
  int local_14;
  
  for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
    iVar1 = strcmp(booleanOptionTags[local_14],in_RDI + 1);
    if (iVar1 == 0) {
      booleanOptions[local_14] = 1;
      return 1;
    }
  }
  sVar2 = strlen(in_RDI);
  if (((3 < sVar2) && (in_RDI[1] == 'n')) && (in_RDI[2] == 'o')) {
    for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
      iVar1 = strcmp(booleanOptionTags[local_14],in_RDI + 3);
      if (iVar1 == 0) {
        booleanOptions[local_14] = 0;
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int checkBooleanOption (char *option)
{
    int o;

    for (o=0;o<MAX_BOOLEAN_OPTIONS;o++)
    {
        if (strcmp (booleanOptionTags[o], &option[1]) == 0)
        {
            booleanOptions[o] = 1;
            return 1;
        }
    }

    if (strlen (option) > 3 && option[1] == 'n' && option[2] == 'o')
        for (o=0;o<MAX_BOOLEAN_OPTIONS;o++)
        {
            if (strcmp (booleanOptionTags[o], &option[3]) == 0)
            {
                booleanOptions[o] = 0;
                return 1;
            }
        }
    return 0;
}